

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 (*pauVar1) [16];
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  ulong extraout_RAX;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float fVar14;
  undefined1 auVar15 [32];
  __m512 afVar16;
  undefined1 auVar18 [56];
  undefined1 auVar17 [64];
  __m128 afVar19;
  binary_op_pow op;
  __m512 _p1;
  __m512 _p;
  binary_op_pow local_15d;
  uint local_15c;
  Mat *local_158;
  Mat *local_150;
  Mat *local_148;
  ulong local_140;
  long local_138;
  long local_130;
  long local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  ulong local_108;
  __m512 local_100;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  local_15c = a->h * a->w * a->d * a->elempack;
  uVar5 = (ulong)local_15c;
  local_108 = 0;
  local_158 = b;
  local_150 = a;
  local_148 = c;
  local_140 = (ulong)(uint)a->c;
  if (a->c < 1) {
    local_140 = local_108;
  }
  for (; local_108 != local_140; local_108 = local_108 + 1) {
    pvVar2 = local_150->data;
    pvVar3 = local_158->data;
    pvVar4 = local_148->data;
    lVar7 = local_148->elemsize * local_148->cstep * local_108;
    lVar9 = local_158->elemsize * local_158->cstep * local_108;
    lVar8 = local_150->elemsize * local_150->cstep * local_108;
    lVar10 = 0;
    local_138 = lVar7;
    local_130 = lVar9;
    local_128 = lVar8;
    local_120 = pvVar4;
    local_118 = pvVar3;
    local_110 = pvVar2;
    for (iVar6 = 0; iVar6 + 0xf < (int)local_15c; iVar6 = iVar6 + 0x10) {
      pfVar11 = (float *)((long)pvVar2 + lVar10 + lVar8);
      local_c0 = *(float (*) [2])pfVar11;
      afStack_b8 = *(float (*) [2])(pfVar11 + 2);
      afStack_b0 = *(float (*) [2])(pfVar11 + 4);
      afStack_a8 = *(float (*) [2])(pfVar11 + 6);
      afStack_a0 = *(float (*) [2])(pfVar11 + 8);
      afStack_98 = *(float (*) [2])(pfVar11 + 10);
      afStack_90 = *(float (*) [2])(pfVar11 + 0xc);
      afStack_88._0_8_ = *(undefined8 *)(pfVar11 + 0xe);
      afVar16 = *(__m512 *)((long)pvVar3 + lVar10 + lVar9);
      local_100 = afVar16;
      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                (&local_15d,(__m512 *)local_c0,&local_100);
      *(__m512 *)((long)pvVar4 + lVar10 + lVar7) = afVar16;
      lVar10 = lVar10 + 0x40;
    }
    for (; iVar6 + 7 < (int)local_15c; iVar6 = iVar6 + 8) {
      pfVar11 = (float *)((long)pvVar2 + lVar10 + lVar8);
      local_c0 = *(float (*) [2])pfVar11;
      afStack_b8 = *(float (*) [2])(pfVar11 + 2);
      afStack_b0 = *(float (*) [2])(pfVar11 + 4);
      afStack_a8 = *(float (*) [2])(pfVar11 + 6);
      auVar15 = *(undefined1 (*) [32])((long)pvVar3 + lVar10 + lVar9);
      local_100[0] = (float)auVar15._0_4_;
      local_100[1] = (float)auVar15._4_4_;
      local_100[2] = (float)auVar15._8_4_;
      local_100[3] = (float)auVar15._12_4_;
      local_100[4] = (float)auVar15._16_4_;
      local_100[5] = (float)auVar15._20_4_;
      local_100[6] = (float)auVar15._24_4_;
      local_100[7] = (float)auVar15._28_4_;
      BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                (&local_15d,(__m256 *)local_c0,(__m256 *)local_100);
      *(undefined1 (*) [32])((long)pvVar4 + lVar10 + lVar7) = auVar15;
      lVar10 = lVar10 + 0x20;
    }
    for (; uVar5 = (ulong)(iVar6 + 3U), (int)(iVar6 + 3U) < (int)local_15c; iVar6 = iVar6 + 4) {
      pfVar11 = (float *)((long)pvVar2 + lVar10 + lVar8);
      local_c0 = *(float (*) [2])pfVar11;
      afStack_b8 = *(float (*) [2])(pfVar11 + 2);
      pauVar1 = (undefined1 (*) [16])((long)pvVar3 + lVar10 + lVar9);
      local_100._0_16_ = *pauVar1;
      auVar18 = ZEXT856(*(ulong *)(*pauVar1 + 8));
      afVar19 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                          (&local_15d,(__m128 *)local_c0,(__m128 *)local_100);
      auVar17._0_8_ = afVar19._0_8_;
      auVar17._8_56_ = auVar18;
      *(undefined1 (*) [16])((long)pvVar4 + lVar10 + lVar7) = auVar17._0_16_;
      lVar10 = lVar10 + 0x10;
    }
    pfVar11 = (float *)((long)local_120 + local_138 + lVar10);
    pfVar13 = (float *)((long)local_118 + local_130 + lVar10);
    pfVar12 = (float *)((long)local_110 + local_128 + lVar10);
    for (; iVar6 < (int)local_15c; iVar6 = iVar6 + 1) {
      fVar14 = powf(*pfVar12,*pfVar13);
      *pfVar11 = fVar14;
      pfVar12 = pfVar12 + 1;
      pfVar13 = pfVar13 + 1;
      pfVar11 = pfVar11 + 1;
      uVar5 = extraout_RAX;
    }
  }
  return (int)uVar5;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}